

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lz4.c
# Opt level: O0

int lz4_reader_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  uint32_t uVar1;
  uchar BD;
  int iStack_34;
  uchar flag;
  uint32_t number;
  int bits_checked;
  ssize_t avail;
  uchar *buffer;
  archive_read_filter *filter_local;
  archive_read_filter_bidder *self_local;
  
  buffer = (uchar *)filter;
  filter_local = (archive_read_filter *)self;
  avail = (ssize_t)__archive_read_filter_ahead(filter,0xb,(ssize_t *)&number);
  if ((void *)avail == (void *)0x0) {
    return 0;
  }
  iStack_34 = 0;
  uVar1 = archive_le32dec((void *)avail);
  if (uVar1 == 0x184d2204) {
    if ((int)(*(byte *)(avail + 4) & 0xc0) >> 6 != 1) {
      return 0;
    }
    if ((*(byte *)(avail + 4) & 2) != 0) {
      return 0;
    }
    if ((uint)((int)(*(byte *)(avail + 5) & 0x70) >> 4) < 4) {
      return 0;
    }
    if ((*(byte *)(avail + 5) & 0x8f) != 0) {
      return 0;
    }
    iStack_34 = 0x30;
  }
  else if (uVar1 == 0x184c2102) {
    iStack_34 = 0x20;
  }
  return iStack_34;
}

Assistant:

static int
lz4_reader_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *buffer;
	ssize_t avail;
	int bits_checked;
	uint32_t number;

	(void)self; /* UNUSED */

	/* Minimal lz4 archive is 11 bytes. */
	buffer = __archive_read_filter_ahead(filter, 11, &avail);
	if (buffer == NULL)
		return (0);

	/* First four bytes must be LZ4 magic numbers. */
	bits_checked = 0;
	if ((number = archive_le32dec(buffer)) == LZ4_MAGICNUMBER) {
		unsigned char flag, BD;

		bits_checked += 32;
		/* Next follows a stream descriptor. */
		/* Descriptor Flags. */
		flag = buffer[4];
		/* A version number must be "01". */
		if (((flag & 0xc0) >> 6) != 1)
			return (0);
		/* A reserved bit must be "0". */
		if (flag & 2)
			return (0);
		bits_checked += 8;
		BD = buffer[5];
		/* A block maximum size should be more than 3. */
		if (((BD & 0x70) >> 4) < 4)
			return (0);
		/* Reserved bits must be "0". */
		if (BD & ~0x70)
			return (0);
		bits_checked += 8;
	} else if (number == LZ4_LEGACY) {
		bits_checked += 32;
	}
	
	return (bits_checked);
}